

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O3

mz_bool mz_zip_reader_extract_file_to_callback
                  (mz_zip_archive *pZip,char *pFilename,mz_file_write_func pCallback,void *pOpaque,
                  mz_uint flags)

{
  mz_uint file_index;
  mz_bool mVar1;
  
  file_index = mz_zip_reader_locate_file(pZip,pFilename,(char *)0x0,flags);
  if (-1 < (int)file_index) {
    mVar1 = mz_zip_reader_extract_to_callback(pZip,file_index,pCallback,pOpaque,flags);
    return mVar1;
  }
  return 0;
}

Assistant:

mz_bool mz_zip_reader_extract_file_to_callback(mz_zip_archive *pZip,
                                               const char *pFilename,
                                               mz_file_write_func pCallback,
                                               void *pOpaque, mz_uint flags) {
  int file_index = mz_zip_reader_locate_file(pZip, pFilename, NULL, flags);
  if (file_index < 0)
    return MZ_FALSE;
  return mz_zip_reader_extract_to_callback(pZip, file_index, pCallback, pOpaque,
                                           flags);
}